

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRackpinion::ChLinkRackpinion(ChLinkRackpinion *this)

{
  double dVar1;
  ChQuaternion<double> local_40;
  
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,true,false,false,false,false,false);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkRackpinion_00b1d170;
  this->R = 0.1;
  this->a1 = 0.0;
  this->alpha = 0.0;
  this->beta = 0.0;
  *(undefined8 *)((long)&this->beta + 1) = 0;
  *(undefined8 *)((long)&this->phase + 1) = 0;
  dVar1 = DAT_00b689a0;
  (this->contact_pt).m_data[0] = VNULL;
  (this->contact_pt).m_data[1] = dVar1;
  (this->contact_pt).m_data[2] = DAT_00b689a8;
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_pinion)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->local_pinion).coord.pos.m_data[0] = 0.0;
  (this->local_pinion).coord.pos.m_data[1] = 0.0;
  (this->local_pinion).coord.pos.m_data[2] = 0.0;
  (this->local_pinion).coord.rot.m_data[0] = 1.0;
  (this->local_pinion).coord.rot.m_data[1] = 0.0;
  (this->local_pinion).coord.rot.m_data[2] = 0.0;
  (this->local_pinion).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_pinion).Amatrix,&local_40);
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_rack)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->local_rack).coord.pos.m_data[0] = 0.0;
  (this->local_rack).coord.pos.m_data[1] = 0.0;
  (this->local_rack).coord.pos.m_data[2] = 0.0;
  (this->local_rack).coord.rot.m_data[0] = 1.0;
  (this->local_rack).coord.rot.m_data[1] = 0.0;
  (this->local_rack).coord.rot.m_data[2] = 0.0;
  (this->local_rack).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_rack).Amatrix,&local_40);
  (this->local_pinion).coord.pos.m_data[0] = 0.0;
  (this->local_pinion).coord.pos.m_data[1] = 0.0;
  (this->local_pinion).coord.pos.m_data[2] = 0.0;
  (this->local_pinion).coord.rot.m_data[0] = 1.0;
  (this->local_pinion).coord.rot.m_data[3] = 0.0;
  (this->local_pinion).coord.rot.m_data[1] = 0.0;
  (this->local_pinion).coord.rot.m_data[2] = 0.0;
  (this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->local_pinion).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  (this->local_rack).coord.pos.m_data[2] = 0.0;
  (this->local_rack).coord.pos.m_data[0] = 0.0;
  (this->local_rack).coord.pos.m_data[1] = 0.0;
  (this->local_rack).coord.rot.m_data[0] = 1.0;
  (this->local_rack).coord.rot.m_data[3] = 0.0;
  (this->local_rack).coord.rot.m_data[1] = 0.0;
  (this->local_rack).coord.rot.m_data[2] = 0.0;
  (this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->local_rack).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  return;
}

Assistant:

ChLinkRackpinion::ChLinkRackpinion()
    : ChLinkMateGeneric(true, false, false, false, false, false),
      R(0.1),
      alpha(0),
      beta(0),
      phase(0),
      checkphase(false),
      a1(0),
      contact_pt(VNULL) {
    local_pinion.SetIdentity();
    local_rack.SetIdentity();
}